

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::DecorationLess::operator()
          (DecorationLess *this,Instruction *lhs,Instruction *rhs)

{
  bool bVar1;
  Op OVar2;
  Op OVar3;
  Op rhsOp;
  Op lhsOp;
  Instruction *rhs_local;
  Instruction *lhs_local;
  DecorationLess *this_local;
  
  if (lhs == (Instruction *)0x0 || rhs == (Instruction *)0x0) {
    __assert_fail("lhs && rhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                  ,0x3e,
                  "bool spvtools::opt::(anonymous namespace)::DecorationLess::operator()(const Instruction *, const Instruction *) const"
                 );
  }
  OVar2 = opt::Instruction::opcode(lhs);
  OVar3 = opt::Instruction::opcode(rhs);
  if (OVar2 != OVar3) {
    if ((OVar2 == OpGroupDecorate) && (OVar3 != OpGroupDecorate)) {
      return true;
    }
    if ((OVar3 == OpGroupDecorate) && (OVar2 != OpGroupDecorate)) {
      return false;
    }
    if ((OVar2 == OpGroupMemberDecorate) && (OVar3 != OpGroupMemberDecorate)) {
      return true;
    }
    if ((OVar3 == OpGroupMemberDecorate) && (OVar2 != OpGroupMemberDecorate)) {
      return false;
    }
    if ((OVar2 == OpDecorate) && (OVar3 != OpDecorate)) {
      return true;
    }
    if ((OVar3 == OpDecorate) && (OVar2 != OpDecorate)) {
      return false;
    }
    if ((OVar2 == OpMemberDecorate) && (OVar3 != OpMemberDecorate)) {
      return true;
    }
    if ((OVar3 == OpMemberDecorate) && (OVar2 != OpMemberDecorate)) {
      return false;
    }
    if ((OVar2 == OpDecorateId) && (OVar3 != OpDecorateId)) {
      return true;
    }
    if ((OVar3 == OpDecorateId) && (OVar2 != OpDecorateId)) {
      return false;
    }
    if ((OVar2 == OpDecorateString) && (OVar3 != OpDecorateString)) {
      return true;
    }
    if ((OVar3 == OpDecorateString) && (OVar2 != OpDecorateString)) {
      return false;
    }
    if ((OVar2 == OpDecorationGroup) && (OVar3 != OpDecorationGroup)) {
      return true;
    }
    if ((OVar3 == OpDecorationGroup) && (OVar2 != OpDecorationGroup)) {
      return false;
    }
  }
  bVar1 = opt::Instruction::operator<(lhs,rhs);
  return bVar1;
}

Assistant:

bool operator()(const Instruction* lhs, const Instruction* rhs) const {
    assert(lhs && rhs);
    spv::Op lhsOp = lhs->opcode();
    spv::Op rhsOp = rhs->opcode();
    if (lhsOp != rhsOp) {
#define PRIORITY_CASE(opcode)                          \
  if (lhsOp == opcode && rhsOp != opcode) return true; \
  if (rhsOp == opcode && lhsOp != opcode) return false;
      // OpGroupDecorate and OpGroupMember decorate are highest priority to
      // eliminate dead targets early and simplify subsequent checks.
      PRIORITY_CASE(spv::Op::OpGroupDecorate)
      PRIORITY_CASE(spv::Op::OpGroupMemberDecorate)
      PRIORITY_CASE(spv::Op::OpDecorate)
      PRIORITY_CASE(spv::Op::OpMemberDecorate)
      PRIORITY_CASE(spv::Op::OpDecorateId)
      PRIORITY_CASE(spv::Op::OpDecorateStringGOOGLE)
      // OpDecorationGroup is lowest priority to ensure use/def chains remain
      // usable for instructions that target this group.
      PRIORITY_CASE(spv::Op::OpDecorationGroup)
#undef PRIORITY_CASE
    }

    // Fall back to maintain total ordering (compare unique ids).
    return *lhs < *rhs;
  }